

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

void __thiscall
xray_re::_lzhuf::Encode
          (_lzhuf *this,uint8_t **_code,size_t *_codesize,uint8_t *_text,size_t _textsize)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  FILE *pFVar4;
  bool bVar5;
  uint local_44;
  int last_match_length;
  int s;
  int r;
  int len;
  int c;
  int i;
  size_t _textsize_local;
  uint8_t *_text_local;
  size_t *_codesize_local;
  uint8_t **_code_local;
  _lzhuf *this_local;
  
  this->m_src_limit = _textsize;
  this->m_src_pos = 0;
  this->m_src = _text;
  this->m_dest_limit = _textsize >> 1;
  this->m_dest_pos = 4;
  pFVar4 = (FILE *)_code;
  puVar2 = (uint8_t *)malloc(this->m_dest_limit);
  this->m_dest = puVar2;
  *(int *)this->m_dest = (int)_textsize;
  this->putbuf = 0;
  this->putlen = '\0';
  StartHuff(this);
  InitTree(this);
  local_44 = 0;
  last_match_length = 0xfc4;
  for (len = 0; len < 0xfc4; len = len + 1) {
    this->text_buf[len] = ' ';
  }
  s = 0;
  while( true ) {
    bVar5 = false;
    if (s < 0x3c) {
      r = getc(this,pFVar4);
      bVar5 = -1 < r;
    }
    if (!bVar5) break;
    this->text_buf[s + 0xfc4] = (uchar)r;
    s = s + 1;
  }
  this->textsize = (long)s;
  for (len = 1; len < 0x3d; len = len + 1) {
    InsertNode(this,0xfc4 - len);
  }
  InsertNode(this,0xfc4);
  do {
    if (s < this->match_length) {
      this->match_length = s;
    }
    if (this->match_length < 3) {
      this->match_length = 1;
      pFVar4 = (FILE *)(ulong)this->text_buf[last_match_length];
      EncodeChar(this,(uint)this->text_buf[last_match_length]);
    }
    else {
      EncodeChar(this,this->match_length + 0xfd);
      pFVar4 = (FILE *)(ulong)(uint)this->match_position;
      EncodePosition(this,this->match_position);
    }
    iVar1 = this->match_length;
    len = 0;
    while( true ) {
      bVar5 = false;
      if (len < iVar1) {
        r = getc(this,pFVar4);
        bVar5 = -1 < r;
      }
      if (!bVar5) break;
      DeleteNode(this,local_44);
      this->text_buf[(int)local_44] = (uchar)r;
      if (local_44 < 0x3b) {
        this->text_buf[(int)(local_44 + 0x1000)] = (uchar)r;
      }
      local_44 = local_44 + 1 & 0xfff;
      last_match_length = last_match_length + 1U & 0xfff;
      pFVar4 = (FILE *)(ulong)(uint)last_match_length;
      InsertNode(this,last_match_length);
      len = len + 1;
    }
    while (iVar3 = len + 1, len < iVar1) {
      DeleteNode(this,local_44);
      local_44 = local_44 + 1 & 0xfff;
      last_match_length = last_match_length + 1U & 0xfff;
      s = s + -1;
      len = iVar3;
      if (s != 0) {
        InsertNode(this,last_match_length);
      }
    }
  } while (0 < s);
  EncodeEnd(this);
  *_code = this->m_dest;
  *_codesize = this->m_dest_pos;
  return;
}

Assistant:

void _lzhuf::Encode(uint8_t*& _code, size_t& _codesize, const uint8_t* _text, size_t _textsize)  /* compression */
{
	int i, c, len, r, s, last_match_length;

	m_src_limit = _textsize;
	m_src_pos = 0;
	m_src = _text;

	m_dest_limit = _textsize/2;
	m_dest_pos = 4;
	m_dest = static_cast<uint8_t*>(malloc(m_dest_limit));
	*(uint32_t*)m_dest = uint32_t(_textsize);

	putbuf = 0;
	putlen = 0;

	StartHuff();
	InitTree();
	s = 0;
	r = N - F;
	for (i = s; i < r; i++)
		text_buf[i] = ' ';
	for (len = 0; len < F && (c = getc()) >= 0; len++)
		text_buf[r + len] = c;
	textsize = len;
	for (i = 1; i <= F; i++)
		InsertNode(r - i);
	InsertNode(r);
	do {
		if (match_length > len)
			match_length = len;
		if (match_length <= THRESHOLD) {
			match_length = 1;
			EncodeChar(text_buf[r]);
		} else {
			EncodeChar(255 - THRESHOLD + match_length);
			EncodePosition(match_position);
		}
		last_match_length = match_length;
		for (i = 0; i < last_match_length && (c = getc()) >= 0; i++) {
			DeleteNode(s);
			text_buf[s] = c;
			if (s < F - 1)
				text_buf[s + N] = c;
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			InsertNode(r);
		}
		while (i++ < last_match_length) {
			DeleteNode(s);
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			if (--len) InsertNode(r);
		}
	} while (len > 0);
	EncodeEnd();
	_code = m_dest;
	_codesize = m_dest_pos;
}